

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

size_t vectorread8<MemoryReader*>(MemoryReader *rd,ByteVector *v,size_t n)

{
  int iVar1;
  undefined4 extraout_var;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(v,n);
  iVar1 = (*(rd->super_ReadWriter)._vptr_ReadWriter[2])
                    (rd,(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start,n);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(v,CONCAT44(extraout_var,iVar1))
  ;
  return (long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
}

Assistant:

size_t vectorread8(PTR rd, ByteVector& v, size_t n)
{
	v.resize(n);
	size_t nr= rd->read((uint8_t*)&v[0], n);
	v.resize(nr);
	return v.size();
}